

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Nonlin.c
# Opt level: O1

DdNode * Llb_NonlinComputeInitState(Aig_Man_t *pAig,DdManager *dd)

{
  abctime aVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  DdNode *pDVar5;
  int iVar6;
  int i;
  DdNode *f;
  
  aVar1 = dd->TimeStop;
  dd->TimeStop = 0;
  pDVar5 = Cudd_ReadOne(dd);
  Cudd_Ref(pDVar5);
  if (0 < pAig->nRegs) {
    iVar6 = 0;
    f = pDVar5;
    do {
      uVar3 = pAig->nTruePis + iVar6;
      if (((int)uVar3 < 0) || (pAig->vCis->nSize <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = pAig->vCis->pArray[uVar3];
      iVar4 = Cudd_ReadSize(dd);
      i = iVar6;
      if (iVar4 != pAig->nRegs) {
        i = *(int *)((long)pvVar2 + 0x24);
      }
      pDVar5 = Cudd_bddIthVar(dd,i);
      pDVar5 = Cudd_bddAnd(dd,f,(DdNode *)((ulong)pDVar5 ^ 1));
      Cudd_Ref(pDVar5);
      Cudd_RecursiveDeref(dd,f);
      iVar6 = iVar6 + 1;
      f = pDVar5;
    } while (iVar6 < pAig->nRegs);
  }
  Cudd_Deref(pDVar5);
  dd->TimeStop = aVar1;
  return pDVar5;
}

Assistant:

DdNode * Llb_NonlinComputeInitState( Aig_Man_t * pAig, DdManager * dd )
{
    Aig_Obj_t * pObj;
    DdNode * bRes, * bVar, * bTemp;
    int i, iVar;
    abctime TimeStop;
    TimeStop = dd->TimeStop;  dd->TimeStop = 0;
    bRes = Cudd_ReadOne( dd );   Cudd_Ref( bRes );
    Saig_ManForEachLo( pAig, pObj, i )
    {
        iVar = (Cudd_ReadSize(dd) == Aig_ManRegNum(pAig)) ? i : Aig_ObjId(pObj);
        bVar = Cudd_bddIthVar( dd, iVar );
        bRes = Cudd_bddAnd( dd, bTemp = bRes, Cudd_Not(bVar) );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bRes );
    dd->TimeStop = TimeStop;
    return bRes;
}